

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  Mat *pMVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  void *pvVar7;
  long *plVar8;
  undefined4 *puVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  string *psVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  Mat local_88;
  string *local_40;
  long local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    uVar13 = lVar12 >> 3;
    lVar12 = uVar13 + (uVar13 == 0);
    lVar15 = 0;
    local_38 = lVar12;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar15]->type);
      if (iVar10 == 0) {
        uVar16 = lVar15 + 1;
        uVar17 = uVar16;
        if (uVar16 < uVar13) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar15]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
            if (((((iVar11 == 0) ||
                  (iVar11 = std::__cxx11::string::compare
                                      ((char *)&(((this->super_ModelWriter).layers)->
                                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                                type), iVar11 == 0)) ||
                 (iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                               type), iVar11 == 0)) ||
                ((iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                               type), iVar11 == 0 ||
                 (iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                               type), iVar11 == 0)))) &&
               ((pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar16],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4 &&
                (lVar12 = local_38, uVar17 = uVar16, *piVar4 == iVar10)))) break;
            uVar16 = uVar16 + 1;
            lVar12 = local_38;
            uVar17 = uVar13;
          } while (uVar16 < uVar13);
        }
        if (uVar17 != uVar13) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[lVar15];
          pLVar6 = ppLVar5[uVar17];
          fprintf(_stderr,"fuse_convolutiondepthwise_activation %s %s\n",
                  (pLVar3->name)._M_dataplus._M_p);
          local_40 = &pLVar6->type;
          iVar10 = std::__cxx11::string::compare((char *)local_40);
          psVar14 = local_40;
          if (iVar10 == 0) {
            if ((*(float *)&pLVar6[1]._vptr_Layer != 0.0) || (NAN(*(float *)&pLVar6[1]._vptr_Layer))
               ) {
              *(undefined4 *)&pLVar3[1].type.field_2 = 2;
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
              pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
              if (pMVar1 != &local_88) {
                piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    pvVar7 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                    plVar8 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                    if (plVar8 == (long *)0x0) {
                      if (pvVar7 != (void *)0x0) {
                        free(pvVar7);
                      }
                    }
                    else {
                      (**(code **)(*plVar8 + 0x18))();
                    }
                  }
                }
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                pMVar1->data = (void *)0x0;
                pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                pLVar3[1].name._M_dataplus._M_p =
                     (pointer)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                pLVar3[1].name._M_string_length =
                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_88.dims;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) = local_88.w;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_88.h;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.d;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_88.c;
                *(size_t *)
                 &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_88.cstep;
              }
              piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
                    if (local_88.data != (void *)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              *(undefined4 *)pMVar1->data = *(undefined4 *)&pLVar6[1]._vptr_Layer;
              goto LAB_0014997f;
            }
            *(undefined4 *)&pLVar3[1].type.field_2 = 1;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)local_40);
            if (iVar10 == 0) {
              *(undefined4 *)&pLVar3[1].type.field_2 = 3;
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
              pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
              if (pMVar1 != &local_88) {
                piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
                piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    pvVar7 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                    plVar8 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                    if (plVar8 == (long *)0x0) {
                      if (pvVar7 != (void *)0x0) {
                        free(pvVar7);
                      }
                    }
                    else {
                      (**(code **)(*plVar8 + 0x18))();
                    }
                  }
                }
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                pMVar1->data = (void *)0x0;
                pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
                pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                pLVar3[1].name._M_dataplus._M_p =
                     (pointer)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                pLVar3[1].name._M_string_length =
                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_88.dims;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) = local_88.w;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_88.h;
                *(int *)((long)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.d;
                *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_88.c;
                *(size_t *)
                 &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_88.cstep;
              }
              piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
LAB_0014991f:
                    if (local_88.data != (void *)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
LAB_0014993b:
              puVar9 = *(undefined4 **)((long)&pLVar3[1].type.field_2 + 8);
              *puVar9 = *(undefined4 *)&pLVar6[1]._vptr_Layer;
              puVar9[1] = *(undefined4 *)((long)&pLVar6[1]._vptr_Layer + 4);
LAB_0014997f:
              local_88.cstep = 0;
              local_88.c = 0;
              local_88.d = 0;
              local_88.h = 0;
              local_88.w = 0;
              local_88.dims = 0;
              local_88.elempack = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.refcount._0_4_ = 0;
              local_88.data = (void *)0x0;
              psVar14 = local_40;
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)psVar14);
              if (iVar10 == 0) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 4;
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)psVar14);
                if (iVar10 == 0) {
                  *(undefined4 *)&pLVar3[1].type.field_2 = 5;
                }
                else {
                  iVar10 = std::__cxx11::string::compare((char *)psVar14);
                  if (iVar10 == 0) {
                    *(undefined4 *)&pLVar3[1].type.field_2 = 6;
                    local_88.cstep = 0;
                    local_88.data = (void *)0x0;
                    local_88.refcount._0_4_ = 0;
                    local_88.refcount._4_4_ = 0;
                    local_88.elemsize._0_4_ = 0;
                    local_88.elemsize._4_4_ = 0;
                    local_88.elempack = 0;
                    local_88.h = 0;
                    local_88.d = 0;
                    local_88.c = 0;
                    local_88.allocator = (Allocator *)0x0;
                    local_88.dims = 0;
                    local_88.w = 0;
                    ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                    pMVar1 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                    if (pMVar1 != &local_88) {
                      piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + 1;
                        UNLOCK();
                      }
                      piVar4 = (int *)pLVar3[1].name._M_dataplus._M_p;
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          pvVar7 = *(void **)((long)&pLVar3[1].type.field_2 + 8);
                          plVar8 = *(long **)((long)&pLVar3[1].name.field_2 + 8);
                          if (plVar8 == (long *)0x0) {
                            if (pvVar7 != (void *)0x0) {
                              free(pvVar7);
                            }
                          }
                          else {
                            (**(code **)(*plVar8 + 0x18))();
                          }
                        }
                      }
                      pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = 0;
                      *(undefined8 *)((long)&pLVar3[1].name._M_dataplus._M_p + 4) = 0;
                      *(undefined8 *)((long)&pLVar3[1].name._M_string_length + 4) = 0;
                      pMVar1->data = (void *)0x0;
                      pLVar3[1].name._M_dataplus._M_p = (pointer)0x0;
                      pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = 0;
                      pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      *(undefined4 *)
                       &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = 0;
                      *(void **)((long)&pLVar3[1].type.field_2 + 8) = local_88.data;
                      pLVar3[1].name._M_dataplus._M_p =
                           (pointer)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                      pLVar3[1].name._M_string_length =
                           CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                      *(int *)&pLVar3[1].name.field_2 = local_88.elempack;
                      *(Allocator **)((long)&pLVar3[1].name.field_2 + 8) = local_88.allocator;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data = local_88.dims;
                      *(int *)((long)&pLVar3[1].bottoms.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + 4) = local_88.w;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_88.h;
                      *(int *)((long)&pLVar3[1].bottoms.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 4) = local_88.d;
                      *(int *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage = local_88.c;
                      *(size_t *)
                       &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data = local_88.cstep;
                    }
                    piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (local_88.allocator == (Allocator *)0x0) goto LAB_0014991f;
                        (*(local_88.allocator)->_vptr_Allocator[3])();
                      }
                    }
                    goto LAB_0014993b;
                  }
                }
              }
            }
          }
          iVar10 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar10;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar10].producer = (int)lVar15;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar14,0,(char *)(pLVar6->type)._M_string_length,0x32319a);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar12);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}